

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Worker.cpp
# Opt level: O0

void __thiscall L14_3::Worker::~Worker(Worker *this)

{
  Worker *this_local;
  
  this->_vptr_Worker = (_func_int **)&PTR_show_data_0015f480;
  std::__cxx11::string::~string((string *)&this->_name);
  return;
}

Assistant:

void Worker::set_data() {
        //  if "cin >> xxx" before "getline(cin, xxx)", might buggy
        //  https://stackoverflow.com/questions/12691316/getline-does-not-work-if-used-after-some-inputs
        std::cin.ignore();
        std::getline(std::cin, _name);
        std::cout << "Enter worker'is id: \n";
        std::cin >> _id;

        //  wait until enter a '\n'
        while(std::cin.get() != '\n') {
            continue;
        }
    }